

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O3

void Acb_NtkResetNode(Acb_Ntk_t *p,int Pivot,word uTruth,Vec_Int_t *vSupp)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  int *piVar5;
  int iVar6;
  Vec_Int_t *p_00;
  int *piVar7;
  word *pwVar8;
  long lVar9;
  Vec_Int_t *pVVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  bool bVar15;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 0x10;
  p_00->nSize = 0;
  piVar7 = (int *)malloc(0x40);
  p_00->pArray = piVar7;
  if (Pivot < 1) {
LAB_003b3b38:
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                  ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
  }
  if ((p->vObjType).nSize <= Pivot) {
LAB_003b3b57:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                  ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
  }
  if (0xfd < (byte)((p->vObjType).pArray[(uint)Pivot] - 5U)) {
    __assert_fail("!Acb_ObjIsCio(p, Pivot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbUtil.c"
                  ,0x28a,"void Acb_NtkResetNode(Acb_Ntk_t *, int, word, Vec_Int_t *)");
  }
  if ((p->vObjFans).nSize <= Pivot) goto LAB_003b3bf7;
  iVar6 = (p->vObjFans).pArray[(uint)Pivot];
  lVar13 = (long)iVar6;
  if ((lVar13 < 0) || ((p->vFanSto).nSize <= iVar6)) goto LAB_003b3bd8;
  piVar7 = (p->vFanSto).pArray;
  if (0 < piVar7[lVar13]) {
    lVar9 = 0;
    do {
      lVar11 = lVar9 + 1;
      lVar9 = lVar9 + 1;
      Vec_IntPush(p_00,piVar7[lVar13 + lVar11]);
    } while (lVar9 < piVar7[lVar13]);
  }
  iVar6 = (p->vObjTruth).nSize;
  if (iVar6 <= Pivot) {
    uVar3 = Pivot + 1;
    iVar2 = (p->vObjTruth).nCap;
    if (Pivot < iVar2 * 2) {
      if (iVar2 <= Pivot) {
        pwVar8 = (p->vObjTruth).pArray;
        if (pwVar8 == (word *)0x0) {
          pwVar8 = (word *)malloc((long)iVar2 << 4);
        }
        else {
          pwVar8 = (word *)realloc(pwVar8,(long)iVar2 << 4);
        }
        (p->vObjTruth).pArray = pwVar8;
        uVar14 = iVar2 * 2;
        goto LAB_003b3855;
      }
    }
    else {
      pwVar8 = (p->vObjTruth).pArray;
      if (pwVar8 == (word *)0x0) {
        pwVar8 = (word *)malloc((ulong)uVar3 << 3);
      }
      else {
        pwVar8 = (word *)realloc(pwVar8,(ulong)uVar3 << 3);
      }
      (p->vObjTruth).pArray = pwVar8;
      uVar14 = uVar3;
LAB_003b3855:
      if (pwVar8 == (word *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                      ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
      }
      (p->vObjTruth).nCap = uVar14;
      iVar6 = (p->vObjTruth).nSize;
    }
    if (iVar6 <= Pivot) {
      memset((p->vObjTruth).pArray + iVar6,0,(ulong)(uint)(Pivot - iVar6) * 8 + 8);
    }
    (p->vObjTruth).nSize = uVar3;
  }
  (p->vObjTruth).pArray[(uint)Pivot] = uTruth;
  if ((p->vCnfs).nSize <= Pivot) goto LAB_003b3b19;
  pVVar10 = (p->vCnfs).pArray;
  piVar7 = pVVar10[(uint)Pivot].pArray;
  pVVar10 = pVVar10 + (uint)Pivot;
  if (piVar7 != (int *)0x0) {
    free(piVar7);
    pVVar10->pArray = (int *)0x0;
  }
  pVVar10->nCap = 0;
  pVVar10->nSize = 0;
  iVar6 = (p->vObjFans).nSize;
  if (iVar6 <= Pivot) {
LAB_003b3bf7:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  piVar7 = (p->vObjFans).pArray;
  iVar2 = piVar7[(uint)Pivot];
  lVar13 = (long)iVar2;
  if ((lVar13 < 0) || ((p->vFanSto).nSize <= iVar2)) {
LAB_003b3bd8:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  piVar4 = (p->vFanSto).pArray;
  if (0 < piVar4[lVar13]) {
    lVar9 = 0;
    do {
      iVar6 = (piVar4 + lVar13)[lVar9 + 1];
      lVar11 = (long)iVar6;
      if ((lVar11 < 0) || ((p->vFanouts).nSize <= iVar6)) goto LAB_003b3b19;
      pVVar10 = (p->vFanouts).pArray;
      iVar6 = pVVar10[lVar11].nSize;
      if ((long)iVar6 < 1) {
        if (iVar6 != 0) {
          __assert_fail("i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,999,"int Vec_IntRemove(Vec_Int_t *, int)");
        }
LAB_003b3b9a:
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                      ,0x223,"void Acb_ObjRemoveFaninFanout(Acb_Ntk_t *, int)");
      }
      lVar9 = lVar9 + 1;
      piVar5 = pVVar10[lVar11].pArray;
      lVar12 = 1;
      while (piVar5[lVar12 + -1] != Pivot) {
        bVar15 = lVar12 == iVar6;
        lVar12 = lVar12 + 1;
        if (bVar15) goto LAB_003b3b9a;
      }
      if ((int)lVar12 < iVar6) {
        do {
          piVar5[lVar12 + -1] = piVar5[lVar12];
          lVar12 = lVar12 + 1;
          iVar6 = pVVar10[lVar11].nSize;
        } while ((int)lVar12 < iVar6);
      }
      pVVar10[lVar11].nSize = iVar6 + -1;
    } while (lVar9 < piVar4[lVar13]);
    iVar6 = (p->vObjFans).nSize;
  }
  if (iVar6 <= Pivot) goto LAB_003b3bf7;
  iVar6 = piVar7[(uint)Pivot];
  if (((long)iVar6 < 0) || ((p->vFanSto).nSize <= iVar6)) goto LAB_003b3bd8;
  puVar1 = (uint *)(piVar4 + iVar6);
  uVar3 = *puVar1;
  if (0 < (int)uVar3) {
    lVar13 = 1;
    do {
      if ((int)puVar1[lVar13] < 1) {
        __assert_fail("pFanins[i] > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                      ,0x1c8,"void Acb_ObjRemoveFanins(Acb_Ntk_t *, int)");
      }
      puVar1[lVar13] = 0xffffffff;
      lVar13 = lVar13 + 1;
    } while ((ulong)uVar3 + 1 != lVar13);
  }
  *puVar1 = 0;
  iVar6 = (p->vFanouts).nSize;
  if (vSupp == (Vec_Int_t *)0x0) {
    if (iVar6 <= Pivot) goto LAB_003b3b19;
    if ((p->vFanouts).pArray[(uint)Pivot].nSize == 0) {
      if ((p->vObjType).nSize <= Pivot) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                      ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
      }
      (p->vObjType).pArray[(uint)Pivot] = '\0';
    }
  }
  else {
    if (iVar6 <= Pivot) {
LAB_003b3b19:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                    ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
    }
    if ((p->vFanouts).pArray[(uint)Pivot].nSize < 1) {
      __assert_fail("Acb_ObjFanoutNum(p, Pivot) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbUtil.c"
                    ,0x296,"void Acb_NtkResetNode(Acb_Ntk_t *, int, word, Vec_Int_t *)");
    }
    Acb_ObjAddFanins(p,Pivot,vSupp);
    Acb_ObjAddFaninFanout(p,Pivot);
  }
  iVar6 = p_00->nSize;
  piVar7 = p_00->pArray;
  if ((long)iVar6 < 1) {
    if (piVar7 == (int *)0x0) goto LAB_003b3b03;
  }
  else {
    lVar13 = 0;
    do {
      iVar2 = piVar7[lVar13];
      lVar9 = (long)iVar2;
      if (lVar9 < 1) goto LAB_003b3b38;
      if ((p->vObjType).nSize <= iVar2) goto LAB_003b3b57;
      if ((byte)((p->vObjType).pArray[lVar9] - 5U) < 0xfe) {
        if ((p->vFanouts).nSize <= iVar2) goto LAB_003b3b19;
        if ((p->vFanouts).pArray[lVar9].nSize == 0) {
          Acb_NtkResetNode(p,iVar2,0,(Vec_Int_t *)0x0);
        }
      }
      lVar13 = lVar13 + 1;
    } while (iVar6 != lVar13);
  }
  free(piVar7);
LAB_003b3b03:
  free(p_00);
  return;
}

Assistant:

void Acb_NtkResetNode( Acb_Ntk_t * p, int Pivot, word uTruth, Vec_Int_t * vSupp )
{
    // remember old fanins
    int k, iFanin, * pFanins; 
    Vec_Int_t * vFanins = Vec_IntAlloc( 6 );
    assert( !Acb_ObjIsCio(p, Pivot) );
    Acb_ObjForEachFaninFast( p, Pivot, pFanins, iFanin, k )
        Vec_IntPush( vFanins, iFanin );
    // update function
    Vec_WrdSetEntry( &p->vObjTruth, Pivot, uTruth );
    Vec_IntErase( Vec_WecEntry(&p->vCnfs, Pivot) );
    // remove old fanins
    Acb_ObjRemoveFaninFanout( p, Pivot );
    Acb_ObjRemoveFanins( p, Pivot );
    // add new fanins
    if ( vSupp != NULL )
    {
        assert( Acb_ObjFanoutNum(p, Pivot) > 0 );
        Acb_ObjAddFanins( p, Pivot, vSupp );
        Acb_ObjAddFaninFanout( p, Pivot );
    }
    else if ( Acb_ObjFanoutNum(p, Pivot) == 0 )
        Acb_ObjCleanType( p, Pivot );
    // delete dangling fanins
    Vec_IntForEachEntry( vFanins, iFanin, k )
        if ( !Acb_ObjIsCio(p, iFanin) && Acb_ObjFanoutNum(p, iFanin) == 0 )
            Acb_NtkResetNode( p, iFanin, 0, NULL );
    Vec_IntFree( vFanins );
}